

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O2

void descrCommand(FILE *outf,char *hdr1,char *hdr2,int argc,char **argv)

{
  tm *__tp;
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  char *__format;
  time_t t;
  
  t = time((time_t *)0x0);
  __tp = localtime(&t);
  pcVar1 = asctime(__tp);
  fprintf((FILE *)outf,"%s %s, run %s",hdr1,"probe.2.26.021123",pcVar1);
  fprintf((FILE *)outf,"%s %s",hdr2,*argv);
  for (lVar3 = 1; lVar3 < argc; lVar3 = lVar3 + 1) {
    pcVar1 = argv[lVar3];
    pcVar2 = strpbrk(pcVar1," \t\n\b\r\v\f\a*\'");
    __format = " \"%s\"";
    if (pcVar2 == (char *)0x0) {
      __format = " %s";
    }
    fprintf((FILE *)outf,__format,pcVar1);
  }
  fputc(10,(FILE *)outf);
  return;
}

Assistant:

void descrCommand(FILE *outf, char *hdr1, char *hdr2, int argc, char **argv)
{
   int i = 0;
   time_t t;
   char *ts = NULL;

   t = time(NULL);
   ts = asctime(localtime(&t)); /* system dependent time string */

   fprintf(outf, "%s %s, run %s", hdr1, shortVersionStr, ts);
   fprintf(outf, "%s %s", hdr2, argv[0]);
   for (i = 1; i < argc; i++) {
      int dontQuote = (strpbrk(argv[i], " \t\n\b\r\v\f\a*\'") == NULL);
      fprintf(outf,(dontQuote?" %s":" \"%s\""), argv[i]);
   }
   fprintf(outf, "\n");
}